

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,void *address,uint pageCount)

{
  uint uVar1;
  char *pcVar2;
  HANDLE pVVar3;
  code *pcVar4;
  int iVar5;
  DWORD DVar6;
  bool bVar7;
  uint uVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar11;
  HANDLE pVVar12;
  DWORD local_24;
  BOOL vpresult;
  DWORD oldProtect;
  uint base;
  uint pageCount_local;
  void *address_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  oldProtect = pageCount;
  _base = address;
  address_local = this;
  if (address < (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1dc,"(address >= this->address)","address >= this->address");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  DVar6 = oldProtect;
  pPVar11 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                      (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
  if (pPVar11->maxAllocPageCount < DVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1dd,"(pageCount <= this->GetAllocator()->maxAllocPageCount)",
                       "pageCount <= this->GetAllocator()->maxAllocPageCount");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pcVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
  iVar5 = (int)_base;
  pPVar11 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                      (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
  if ((pPVar11->maxAllocPageCount - oldProtect) * 0x1000 < (uint)(iVar5 - (int)pcVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1de,
                       "(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize)"
                       ,
                       "((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize"
                      );
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar7 = IsFreeOrDecommitted(this,_base,oldProtect);
  if (bVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1df,"(!IsFreeOrDecommitted(address, pageCount))",
                       "!IsFreeOrDecommitted(address, pageCount)");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  vpresult = GetBitRangeBase(this,_base);
  SetRangeInFreePagesBitVector(this,vpresult,oldProtect);
  this->freePageCount = oldProtect + this->freePageCount;
  uVar1 = this->freePageCount;
  uVar8 = GetCountOfFreePages(this);
  if (uVar1 != uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x1e4,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar7) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pPVar11 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                      (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
  pVVar3 = pPVar11->processHandle;
  pVVar12 = GetCurrentProcess();
  if (pVVar3 == pVVar12) {
    BVar9 = VirtualProtect(_base,(ulong)(oldProtect << 0xc),1,&local_24);
    if (BVar9 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x1eb,"(vpresult != 0)","vpresult != FALSE");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    if (local_24 != 4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x1ec,"(oldProtect == 0x04)","oldProtect == PAGE_READWRITE");
      if (!bVar7) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::ReleasePages(__in void * address, uint pageCount)
{
    Assert(address >= this->address);
    Assert(pageCount <= this->GetAllocator()->maxAllocPageCount);
    Assert(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) *  AutoSystemInfo::PageSize);
    Assert(!IsFreeOrDecommitted(address, pageCount));

    uint base = this->GetBitRangeBase(address);
    this->SetRangeInFreePagesBitVector(base, pageCount);
    this->freePageCount += pageCount;
    Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
    if (this->GetAllocator()->processHandle == GetCurrentProcess())
    {
        DWORD oldProtect;
        BOOL vpresult = VirtualProtect(address, pageCount * AutoSystemInfo::PageSize, PAGE_NOACCESS, &oldProtect);
        Assert(vpresult != FALSE);
        Assert(oldProtect == PAGE_READWRITE);
    }
#endif

}